

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# response.c
# Opt level: O0

void cod_ev_discard_and_submit_rel(cod_exec_context ec,int port,int queue,int index)

{
  EVstone EVar1;
  long lVar2;
  int in_EDX;
  uint in_ESI;
  undefined8 in_RDI;
  EVstone target_stone;
  cod_exec_context unaff_retaddr;
  ev_state_data *ev_state;
  undefined4 in_stack_ffffffffffffffd8;
  undefined4 in_stack_ffffffffffffffdc;
  
  lVar2 = cod_get_client_data(in_RDI,0x34567890);
  EVar1 = port_to_stone((ev_state_data *)
                        CONCAT44(in_stack_ffffffffffffffdc,in_stack_ffffffffffffffd8),0);
  if (EVar1 == -1) {
    printf("Port %d on stone %d invalid\n",(ulong)in_ESI,(ulong)*(uint *)(lVar2 + 0x10));
  }
  else {
    cod_ev_discard_and_submit(unaff_retaddr,(int)((ulong)in_RDI >> 0x20),(int)in_RDI,in_ESI,in_EDX);
  }
  return;
}

Assistant:

static void cod_ev_discard_and_submit_rel(cod_exec_context ec, int port, int queue,
        int index) {
    struct ev_state_data *ev_state = (void*) cod_get_client_data(ec, 0x34567890);
    EVstone target_stone = port_to_stone(ev_state, port);
    if (target_stone == -1) {
        printf("Port %d on stone %d invalid\n", port, ev_state->stone);
	return;
    }

    cod_ev_discard_and_submit(ec, 0, port, queue, index);
}